

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O0

int evfilt_write_knote_delete(filter *filt,knote *kn)

{
  int iVar1;
  long in_RSI;
  _Bool in_stack_0000002b;
  int in_stack_0000002c;
  knote *in_stack_00000030;
  filter *in_stack_00000038;
  int in_stack_00000040;
  int local_4;
  
  if (((*(uint *)(in_RSI + 0x20) & 1) == 0) || (*(int *)(in_RSI + 0x80) == -1)) {
    local_4 = epoll_update(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_0000002c,
                           in_stack_0000002b);
  }
  else {
    if ((*(int *)(in_RSI + 0x6c) != 0) &&
       (iVar1 = epoll_ctl(*(int *)(in_RSI + 0x68),2,*(int *)(in_RSI + 0x80),(epoll_event *)0x0),
       iVar1 < 0)) {
      return -1;
    }
    *(undefined4 *)(in_RSI + 0x6c) = 0;
    close(*(int *)(in_RSI + 0x80));
    *(undefined4 *)(in_RSI + 0x80) = 0xffffffff;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
evfilt_write_knote_delete(struct filter *filt, struct knote *kn)
{
    if ((kn->kn_flags & KNFL_FILE) && (kn->kn_eventfd != -1)) {
        if (kn->kn_registered && epoll_ctl(kn->kn_epollfd, EPOLL_CTL_DEL, kn->kn_eventfd, NULL) < 0) {
            dbg_perror("epoll_ctl(2)");
            return (-1);
        }
        kn->kn_registered = 0;
        (void) close(kn->kn_eventfd);
        kn->kn_eventfd = -1;
        return (0);
    }

    return epoll_update(EPOLL_CTL_DEL, filt, kn, EPOLLOUT, true);
}